

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

int format_hex(int64_t v,void *p,int digits)

{
  long v_00;
  undefined4 local_2c;
  int ret;
  int64_t max;
  int digits_local;
  void *p_local;
  int64_t v_local;
  
  v_00 = (1L << ((byte)(digits << 2) & 0x3f)) + -1;
  if ((v < 0) || (v_00 < v)) {
    format_hex_recursive(v_00,(char *)p,digits);
    local_2c = -1;
  }
  else {
    format_hex_recursive(v,(char *)p,digits);
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

static int
format_hex(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 4)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_hex_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_hex_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}